

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMultiProcessHandler::SetTests
          (cmCTestMultiProcessHandler *this,TestMap *tests,PropertiesMap *properties)

{
  bool bVar1;
  size_type sVar2;
  PropertiesMap *properties_local;
  TestMap *tests_local;
  cmCTestMultiProcessHandler *this_local;
  
  TestMap::operator=(&this->PendingTests,tests);
  PropertiesMap::operator=(&this->Properties,properties);
  sVar2 = std::
          map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
          ::size(&(this->PendingTests).
                  super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                );
  this->Total = sVar2;
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (!bVar1) {
    ReadCostData(this);
    bVar1 = CheckCycles(this);
    this->HasCycles = (bool)((bVar1 ^ 0xffU) & 1);
    bVar1 = CheckGeneratedResourceSpec(this);
    this->HasInvalidGeneratedResourceSpec = (bool)((bVar1 ^ 0xffU) & 1);
    if (((this->HasCycles & 1U) != 0) || ((this->HasInvalidGeneratedResourceSpec & 1U) != 0)) {
      return false;
    }
    CreateTestCostList(this);
  }
  return true;
}

Assistant:

bool cmCTestMultiProcessHandler::SetTests(TestMap tests,
                                          PropertiesMap properties)
{
  this->PendingTests = std::move(tests);
  this->Properties = std::move(properties);
  this->Total = this->PendingTests.size();
  if (!this->CTest->GetShowOnly()) {
    this->ReadCostData();
    this->HasCycles = !this->CheckCycles();
    this->HasInvalidGeneratedResourceSpec =
      !this->CheckGeneratedResourceSpec();
    if (this->HasCycles || this->HasInvalidGeneratedResourceSpec) {
      return false;
    }
    this->CreateTestCostList();
  }
  return true;
}